

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O2

SpatialRigidBodyInertia * __thiscall
RigidBodyDynamics::Math::SpatialTransform::applyTranspose
          (SpatialRigidBodyInertia *__return_storage_ptr__,SpatialTransform *this,
          SpatialRigidBodyInertia *rbi)

{
  double dVar1;
  Vector3d E_T_mr;
  double local_278;
  undefined4 uStack_270;
  uint uStack_26c;
  undefined4 uStack_268;
  uint uStack_264;
  SpatialTransform *local_260;
  Vector3d *local_258;
  undefined8 local_250;
  undefined4 local_248;
  uint uStack_244;
  undefined4 uStack_240;
  uint uStack_23c;
  double local_238;
  double dStack_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  SpatialTransform *local_1e8;
  SpatialTransform *local_1e0;
  double *local_1d8;
  SpatialTransform *local_1d0;
  undefined8 *local_1c8;
  Vector3d *local_1c0;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  double local_198;
  double dStack_190;
  double local_188;
  double local_178;
  double local_170;
  double local_158;
  undefined8 local_150 [2];
  undefined4 local_140;
  uint uStack_13c;
  undefined4 uStack_138;
  uint uStack_134;
  undefined8 local_130;
  double local_128;
  undefined4 local_120;
  uint uStack_11c;
  double local_118;
  undefined8 local_110;
  undefined8 local_108 [2];
  undefined4 local_f8;
  uint uStack_f4;
  undefined4 uStack_f0;
  uint uStack_ec;
  undefined8 local_e8;
  double local_e0;
  undefined4 local_d8;
  uint uStack_d4;
  undefined4 uStack_d0;
  uint uStack_cc;
  undefined8 local_c8;
  undefined8 local_c0 [2];
  undefined4 local_b0;
  uint uStack_ac;
  undefined4 uStack_a8;
  uint uStack_a4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  uint uStack_8c;
  undefined4 uStack_88;
  uint uStack_84;
  undefined8 local_80;
  undefined8 local_78 [2];
  undefined4 local_68;
  uint uStack_64;
  undefined4 uStack_60;
  uint uStack_5c;
  undefined8 local_58;
  double local_50;
  undefined4 local_48;
  uint uStack_44;
  double local_40;
  undefined8 local_38;
  
  local_1c0 = &this->r;
  local_1c8 = (undefined8 *)rbi->m;
  local_1e8 = this;
  local_1e0 = (SpatialTransform *)&rbi->h;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_278,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_1e8);
  dVar1 = rbi->m;
  local_238 = rbi->Ixx;
  dStack_230 = rbi->Iyx;
  local_218 = rbi->Iyy;
  local_228 = rbi->Izx;
  local_210 = rbi->Izy;
  local_1f8 = rbi->Izz;
  local_50 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
  local_78[0] = 0;
  local_58 = 0;
  local_40 = -local_50;
  local_68 = *(undefined4 *)
              ((this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               .m_storage.m_data.array + 1);
  uStack_44 = *(uint *)((long)(this->r).super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + 0xc);
  uStack_60 = *(undefined4 *)
               ((this->r).super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               + 2);
  uStack_64 = uStack_44 ^ 0x80000000;
  uStack_5c = *(uint *)((long)(this->r).super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + 0x14) ^ 0x80000000;
  local_38 = 0;
  local_260 = this;
  local_258 = &rbi->h;
  local_220 = dStack_230;
  local_208 = local_228;
  dStack_200 = local_210;
  local_48 = local_68;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_250,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_260);
  uStack_88 = (undefined4)local_250;
  local_1c0 = (Vector3d *)local_c0;
  local_c0[0] = 0;
  uStack_84 = (uint)((ulong)local_250 >> 0x20) ^ 0x80000000;
  local_a0 = 0;
  local_90 = local_248;
  uStack_8c = uStack_244;
  uStack_ac = uStack_244 ^ 0x80000000;
  uStack_a4 = uStack_23c ^ 0x80000000;
  local_b0 = local_248;
  uStack_a8 = uStack_240;
  local_98 = local_250;
  local_80 = 0;
  uStack_d0 = SUB84(local_278,0);
  uStack_cc = (uint)((ulong)local_278 >> 0x20) ^ 0x80000000;
  local_1b0 = local_108;
  local_108[0] = 0;
  local_e8 = 0;
  local_d8 = uStack_270;
  uStack_d4 = uStack_26c;
  uStack_f4 = uStack_26c ^ 0x80000000;
  uStack_ec = uStack_264 ^ 0x80000000;
  local_f8 = uStack_270;
  uStack_f0 = uStack_268;
  local_e0 = local_278;
  local_c8 = 0;
  local_128 = (this->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  local_1a8 = local_150;
  local_150[0] = 0;
  local_130 = 0;
  local_118 = -local_128;
  local_140 = *(undefined4 *)
               ((this->r).super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               + 1);
  uStack_11c = *(uint *)((long)(this->r).super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array + 0xc);
  uStack_138 = *(undefined4 *)
                ((this->r).super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                + 2);
  uStack_13c = uStack_11c ^ 0x80000000;
  uStack_134 = *(uint *)((long)(this->r).super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array + 0x14) ^ 0x80000000;
  local_110 = 0;
  local_1d8 = &local_238;
  local_1e0 = this;
  local_1d0 = this;
  local_1c8 = local_78;
  local_120 = local_140;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_198,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>_>
              *)&local_1e8);
  __return_storage_ptr__->m = dVar1;
  (__return_storage_ptr__->h).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = local_278
  ;
  (__return_storage_ptr__->h).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)CONCAT44(uStack_26c,uStack_270);
  (__return_storage_ptr__->h).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)CONCAT44(uStack_264,uStack_268);
  __return_storage_ptr__->Ixx = local_198;
  __return_storage_ptr__->Iyx = dStack_190;
  __return_storage_ptr__->Iyy = local_178;
  __return_storage_ptr__->Izx = local_188;
  __return_storage_ptr__->Izy = local_170;
  __return_storage_ptr__->Izz = local_158;
  return __return_storage_ptr__;
}

Assistant:

SpatialRigidBodyInertia applyTranspose (const SpatialRigidBodyInertia &rbi) {
		Vector3d E_T_mr = E.transpose() * rbi.h + rbi.m * r;
		return SpatialRigidBodyInertia (
				rbi.m,
				E_T_mr,
				E.transpose() * 
					 	Matrix3d (
							rbi.Ixx, rbi.Iyx, rbi.Izx,
							rbi.Iyx, rbi.Iyy, rbi.Izy,
							rbi.Izx, rbi.Izy, rbi.Izz
							) * E
					- VectorCrossMatrix(r) * VectorCrossMatrix (E.transpose() * rbi.h)  
					- VectorCrossMatrix (E_T_mr) * VectorCrossMatrix (r));
	}